

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_GetStateNull_Test::TestBody
          (StatePointer_GetStateNull_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_98;
  Message local_90;
  unsigned_long local_88;
  state_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_60 [3];
  Message local_48;
  Foo *local_40;
  pointer_type local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  Foo foo;
  StatePointer_GetStateNull_Test *this_local;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_,
             (pointer_type)((long)&p.m_ptr_and_state + 4),0);
  local_38 = putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                       ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                        &gtest_ar.message_);
  local_40 = (Foo *)((long)&p.m_ptr_and_state + 4);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            ((EqHelper<false> *)local_30,"p.get_ptr()","&foo",&local_38,&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    testing::Message::~Message(&local_48);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_80 = putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                         ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                          &gtest_ar.message_);
    local_88 = 0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_78,"p.get_state()","0ul",&local_80,&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                 ,0x20,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      testing::Message::~Message(&local_90);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  }
  return;
}

Assistant:

TEST(StatePointer, GetStateNull) {
	Foo foo;
	state_ptr<Foo> p{&foo, 0};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 0ul);
}